

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

string * __thiscall
libcellml::Printer::PrinterImpl::printVariable
          (string *__return_storage_ptr__,PrinterImpl *this,VariablePtr *variable,IdList *idList,
          bool autoIds)

{
  bool bVar1;
  element_type *peVar2;
  element_type *this_00;
  ulong uVar3;
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  string interface_type;
  string initial_value;
  undefined1 local_c0 [32];
  undefined1 local_a0 [8];
  string units;
  string id;
  string name;
  bool autoIds_local;
  IdList *idList_local;
  VariablePtr *variable_local;
  PrinterImpl *this_local;
  string *repr;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"<variable");
  peVar2 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)variable);
  NamedEntity::name_abi_cxx11_((string *)((long)&id.field_2 + 8),&peVar2->super_NamedEntity);
  peVar2 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)variable);
  Entity::id_abi_cxx11_((string *)((long)&units.field_2 + 8),(Entity *)peVar2);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             variable);
  initial_value.field_2._M_local_buf[0xf] = '\0';
  initial_value.field_2._M_local_buf[0xd] = '\0';
  Variable::units((Variable *)(local_c0 + 0x10));
  bVar1 = std::operator!=((shared_ptr<libcellml::Units> *)(local_c0 + 0x10),(nullptr_t)0x0);
  if (bVar1) {
    std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )variable);
    Variable::units((Variable *)local_c0);
    initial_value.field_2._M_local_buf[0xf] = '\x01';
    this_00 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_c0);
    NamedEntity::name_abi_cxx11_((string *)local_a0,&this_00->super_NamedEntity);
  }
  else {
    std::allocator<char>::allocator();
    initial_value.field_2._M_local_buf[0xd] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a0,"",(allocator<char> *)(initial_value.field_2._M_local_buf + 0xe));
  }
  if ((initial_value.field_2._M_local_buf[0xd] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(initial_value.field_2._M_local_buf + 0xe));
  }
  if ((initial_value.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_c0);
  }
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)(local_c0 + 0x10));
  peVar2 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)variable);
  Variable::initialValue_abi_cxx11_((string *)((long)&interface_type.field_2 + 8),peVar2);
  peVar2 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)variable);
  Variable::interfaceType_abi_cxx11_((string *)local_108,peVar2);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::operator+(&local_148," name=\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&id.field_2 + 8));
    std::operator+(&local_128,&local_148,"\"");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::operator+(&local_188," units=\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    std::operator+(&local_168,&local_188,"\"");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::operator+(&local_1c8," initial_value=\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&interface_type.field_2 + 8));
    std::operator+(&local_1a8,&local_1c8,"\"");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::operator+(&local_208," interface=\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
    std::operator+(&local_1e8,&local_208,"\"");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::operator+(&local_248," id=\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&units.field_2 + 8));
    std::operator+(&local_228,&local_248,"\"");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
  }
  else if (autoIds) {
    makeUniqueId(&local_2a8,idList);
    std::operator+(&local_288," id=\"",&local_2a8);
    std::operator+(&local_268,&local_288,"\"");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/>");
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)(interface_type.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)(units.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(id.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string Printer::PrinterImpl::printVariable(const VariablePtr &variable, IdList &idList, bool autoIds)
{
    std::string repr;
    repr += "<variable";
    std::string name = variable->name();
    std::string id = variable->id();
    std::string units = variable->units() != nullptr ? variable->units()->name() : "";
    std::string initial_value = variable->initialValue();
    std::string interface_type = variable->interfaceType();
    if (!name.empty()) {
        repr += " name=\"" + name + "\"";
    }
    if (!units.empty()) {
        repr += " units=\"" + units + "\"";
    }
    if (!initial_value.empty()) {
        repr += " initial_value=\"" + initial_value + "\"";
    }
    if (!interface_type.empty()) {
        repr += " interface=\"" + interface_type + "\"";
    }
    if (!id.empty()) {
        repr += " id=\"" + id + "\"";
    } else if (autoIds) {
        repr += " id=\"" + makeUniqueId(idList) + "\"";
    }

    repr += "/>";
    return repr;
}